

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

void __thiscall Omega_h::ExprEnv::ExprEnv(ExprEnv *this,LO size_in,Int dim_in)

{
  int iVar1;
  undefined1 *puVar2;
  double local_6b0;
  undefined8 local_698;
  undefined8 local_680;
  double local_5b0;
  any local_5a8;
  allocator local_589;
  string local_588 [32];
  Matrix<1,_1> local_568;
  any local_560;
  allocator local_541;
  string local_540 [32];
  undefined1 local_520 [8];
  Matrix<2,_2> a_1;
  allocator local_4e1;
  string local_4e0 [32];
  undefined1 local_4c0 [8];
  Matrix<3,_3> a;
  allocator local_459;
  string local_458 [32];
  double local_438;
  any local_430;
  allocator local_411;
  string local_410 [32];
  anon_class_8_2_f519a19c local_3f0;
  Function local_3e8;
  allocator local_3c1;
  string local_3c0 [32];
  anon_class_8_2_9bcb0b86 local_3a0;
  Function local_398;
  allocator local_371;
  string local_370 [32];
  anon_class_8_2_9bcb0b86 local_350;
  Function local_348;
  allocator local_321;
  string local_320 [32];
  anon_class_8_2_9bcb0b86 local_300;
  Function local_2f8;
  allocator local_2d1;
  string local_2d0 [32];
  anon_class_8_2_9bcb0b86 local_2b0;
  Function local_2a8;
  allocator local_281;
  string local_280 [36];
  anon_class_4_1_eb2cee13 local_25c;
  Function local_258;
  allocator local_231;
  string local_230 [36];
  anon_class_4_1_eb2cee13 local_20c;
  Function local_208;
  allocator local_1e1;
  string local_1e0 [36];
  anon_class_4_1_eb2cee13 local_1bc;
  Function local_1b8;
  allocator local_191;
  string local_190 [36];
  anon_class_4_1_eb2cee13 local_16c;
  Function local_168;
  allocator local_141;
  string local_140 [36];
  anon_class_4_1_eb2cee13 local_11c;
  Function local_118;
  allocator local_e1;
  string local_e0 [32];
  Int local_c0;
  LO local_bc;
  Int local_dim;
  LO local_size;
  Int dim_in_local;
  LO size_in_local;
  ExprEnv *this_local;
  int local_9c;
  int local_98;
  Int i;
  Int j;
  int local_8c;
  undefined1 *local_88;
  int local_7c;
  undefined1 *local_78;
  int local_6c;
  int local_68;
  Int i_1;
  Int j_1;
  int local_5c;
  undefined1 *local_58;
  int local_4c;
  undefined1 *local_48;
  int local_40;
  int local_3c;
  Int i_2;
  Int j_2;
  Few<Omega_h::Vector<1>,_1> local_30;
  Matrix<1,_1> a_2;
  
  local_dim = dim_in;
  local_size = size_in;
  _dim_in_local = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
  ::map(&this->variables);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>_>
  ::map(&this->functions);
  this->size = local_size;
  this->dim = local_dim;
  local_bc = this->size;
  local_c0 = this->dim;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"exp",&local_e1);
  local_11c.local_size = local_bc;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__0,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_118,&local_11c);
  register_function(this,(string *)local_e0,&local_118);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_118);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"sqrt",&local_141);
  local_16c.local_size = local_bc;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__1,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_168,&local_16c);
  register_function(this,(string *)local_140,&local_168);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_168);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"sin",&local_191);
  local_1bc.local_size = local_bc;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__2,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_1b8,&local_1bc);
  register_function(this,(string *)local_190,&local_1b8);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_1b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"cos",&local_1e1);
  local_20c.local_size = local_bc;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__3,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_208,&local_20c);
  register_function(this,(string *)local_1e0,&local_208);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_208);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"erf",&local_231);
  local_25c.local_size = local_bc;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__4,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_258,&local_25c);
  register_function(this,(string *)local_230,&local_258);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_258);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"vector",&local_281);
  local_2b0.local_size = local_bc;
  local_2b0.local_dim = local_c0;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__5,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_2a8,&local_2b0);
  register_function(this,(string *)local_280,&local_2a8);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_2a8);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"symm",&local_2d1);
  local_300.local_size = local_bc;
  local_300.local_dim = local_c0;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__6,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_2f8,&local_300);
  register_function(this,(string *)local_2d0,&local_2f8);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_2f8);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"matrix",&local_321);
  local_350.local_size = local_bc;
  local_350.local_dim = local_c0;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__7,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_348,&local_350);
  register_function(this,(string *)local_320,&local_348);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_348);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"tensor",&local_371);
  local_3a0.local_size = local_bc;
  local_3a0.local_dim = local_c0;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__8,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_398,&local_3a0);
  register_function(this,(string *)local_370,&local_398);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_398);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"norm",&local_3c1);
  local_3f0.local_dim = local_c0;
  local_3f0.local_size = local_bc;
  std::function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)>::
  function<Omega_h::ExprEnv::ExprEnv(int,int)::__9,void>
            ((function<Omega_h::any(std::vector<Omega_h::any,std::allocator<Omega_h::any>>&)> *)
             &local_3e8,&local_3f0);
  register_function(this,(string *)local_3c0,&local_3e8);
  std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
  ~function(&local_3e8);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"d",&local_411);
  local_438 = (double)this->dim;
  any::any<double,void>(&local_430,&local_438);
  register_variable(this,(string *)local_410,&local_430);
  any::~any(&local_430);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  if (this->dim == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"I",&local_459);
    j = 3;
    i = 3;
    for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
      for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
        local_680 = 0x3ff0000000000000;
        if (local_9c != local_98) {
          local_680 = 0;
        }
        puVar2 = local_4c0 + (long)local_98 * 0x18;
        iVar1 = local_9c;
        *(undefined8 *)(puVar2 + (long)local_9c * 8) = local_680;
        local_8c = local_98;
        local_88 = local_4c0;
        local_7c = iVar1;
        local_78 = puVar2;
      }
    }
    any::any<Omega_h::Matrix<3,3>,void>
              ((any *)(a.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2)
               ,(Matrix<3,_3> *)local_4c0);
    register_variable(this,(string *)local_458,
                      (any *)(a.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.
                              array_ + 2));
    any::~any((any *)(a.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2))
    ;
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
  }
  if (this->dim == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"I",&local_4e1);
    j_1 = 2;
    i_1 = 2;
    for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
        local_698 = 0x3ff0000000000000;
        if (local_6c != local_68) {
          local_698 = 0;
        }
        puVar2 = local_520 + (long)local_68 * 0x10;
        iVar1 = local_6c;
        *(undefined8 *)(puVar2 + (long)local_6c * 8) = local_698;
        local_5c = local_68;
        local_58 = local_520;
        local_4c = iVar1;
        local_48 = puVar2;
      }
    }
    any::any<Omega_h::Matrix<2,2>,void>
              ((any *)(a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_ +
                      1),(Matrix<2,_2> *)local_520);
    register_variable(this,(string *)local_4e0,
                      (any *)(a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                              array_ + 1));
    any::~any((any *)(a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_ + 1
                     ));
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  }
  if (this->dim == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"I",&local_541);
    j_2 = 1;
    i_2 = 1;
    for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < 1; local_40 = local_40 + 1) {
        local_6b0 = 1.0;
        if (local_40 != local_3c) {
          local_6b0 = 0.0;
        }
        iVar1 = local_40;
        (&a_2)[(long)local_3c + (long)local_40 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
        super_Few<double,_1>.array_[0] = local_6b0;
        a_2.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]._4_4_ = iVar1;
      }
    }
    this_local = (ExprEnv *)local_30.array_[0].super_Few<double,_1>.array_[0];
    local_568.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0] =
         (Few<Omega_h::Vector<1>,_1>)
         (Few<Omega_h::Vector<1>,_1>)local_30.array_[0].super_Few<double,_1>.array_[0];
    any::any<Omega_h::Matrix<1,1>,void>(&local_560,&local_568);
    register_variable(this,(string *)local_540,&local_560);
    any::~any(&local_560);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"pi",&local_589);
  local_5b0 = 3.141592653589793;
  any::any<double,void>(&local_5a8,&local_5b0);
  register_variable(this,(string *)local_588,&local_5a8);
  any::~any(&local_5a8);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  return;
}

Assistant:

ExprEnv::ExprEnv(LO size_in, Int dim_in) : size(size_in), dim(dim_in) {
  auto local_size = size;
  auto local_dim = dim;
  register_function(
      "exp", [=](Args& args) { return eval_exp(local_size, args); });
  register_function(
      "sqrt", [=](Args& args) { return eval_sqrt(local_size, args); });
  register_function(
      "sin", [=](Args& args) { return eval_sin(local_size, args); });
  register_function(
      "cos", [=](Args& args) { return eval_cos(local_size, args); });
  register_function(
      "erf", [=](Args& args) { return eval_erf(local_size, args); });
  register_function("vector",
      [=](Args& args) { return make_vector(local_size, local_dim, args); });
  register_function("symm",
      [=](Args& args) { return make_symm(local_size, local_dim, args); });
  register_function("matrix",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("tensor",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("norm",
      [=](Args& args) { return eval_norm(local_dim, local_size, args); });
  register_variable("d", any(Real(dim)));
  if (dim == 3) register_variable("I", any(identity_matrix<3, 3>()));
  if (dim == 2) register_variable("I", any(identity_matrix<2, 2>()));
  if (dim == 1) register_variable("I", any(identity_matrix<1, 1>()));
  register_variable("pi", any(Real(Omega_h::PI)));
}